

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 print_counts(char *countfn,phnhashelement_t **CIhash,hashelement_t **CDhash)

{
  phnhashelement_t *ppVar1;
  hashelement_t *phVar2;
  FILE *pFVar3;
  int heapsize;
  int32 iVar4;
  heapelement_t *phVar5;
  char *pcVar6;
  long lVar7;
  hashelement_t **pphVar8;
  phnhashelement_t **pppVar9;
  bool bVar10;
  int32 ciheapsize;
  int32 cdheapsize;
  long local_60;
  FILE *local_58;
  heapelement_t **CIheap;
  heapelement_t **CDheap;
  phnhashelement_t **local_40;
  hashelement_t **local_38;
  
  CDheap = (heapelement_t **)0x0;
  CIheap = (heapelement_t **)0x0;
  local_40 = CIhash;
  local_38 = CDhash;
  local_58 = fopen(countfn,"w");
  if (local_58 == (FILE *)0x0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x2b8,"Unable to open %s for writing. Not writing counts!\n",countfn);
    iVar4 = -1;
  }
  else {
    fwrite("base\tleft\tright\twdpos\tcount\n",0x1c,1,local_58);
    ciheapsize = 0;
    heapsize = 0;
    lVar7 = 0;
    while (pFVar3 = local_58, lVar7 != 0x65) {
      pppVar9 = local_40 + lVar7;
      local_60 = lVar7;
      while (ppVar1 = *pppVar9, ppVar1 != (phnhashelement_t *)0x0) {
        if (0 < ppVar1->count) {
          phVar5 = (heapelement_t *)
                   __ckd_calloc__(1,0x28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                  ,0x2c5);
          pcVar6 = strdup(ppVar1->phone);
          phVar5->basephone = pcVar6;
          phVar5->count = ppVar1->count;
          heapsize = insert(&CIheap,heapsize,phVar5);
          ciheapsize = heapsize;
        }
        pppVar9 = &ppVar1->next;
      }
      lVar7 = local_60 + 1;
    }
    if (heapsize < 1) {
      heapsize = 0;
    }
    while (bVar10 = heapsize != 0, heapsize = heapsize + -1, bVar10) {
      phVar5 = yanktop(&CIheap,ciheapsize,&ciheapsize);
      fprintf(pFVar3,"%s\t-\t-\t-\t%d\n",phVar5->basephone);
      free_heapelement(phVar5);
    }
    cdheapsize = 0;
    iVar4 = 0;
    lVar7 = 0;
    while (pFVar3 = local_58, lVar7 != 0x5dc1) {
      pphVar8 = local_38 + lVar7;
      local_60 = lVar7;
      while (phVar2 = *pphVar8, phVar2 != (hashelement_t *)0x0) {
        if (0 < phVar2->count) {
          phVar5 = (heapelement_t *)
                   __ckd_calloc__(1,0x28,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                  ,0x2db);
          pcVar6 = strdup(phVar2->basephone);
          phVar5->basephone = pcVar6;
          pcVar6 = strdup(phVar2->leftcontext);
          phVar5->leftcontext = pcVar6;
          pcVar6 = strdup(phVar2->rightcontext);
          phVar5->rightcontext = pcVar6;
          pcVar6 = strdup(phVar2->wordposition);
          phVar5->wordposition = pcVar6;
          phVar5->count = phVar2->count;
          iVar4 = insert(&CDheap,iVar4,phVar5);
          cdheapsize = iVar4;
        }
        pphVar8 = &phVar2->next;
      }
      lVar7 = local_60 + 1;
    }
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    while (bVar10 = iVar4 != 0, iVar4 = iVar4 + -1, bVar10) {
      phVar5 = yanktop(&CDheap,cdheapsize,&cdheapsize);
      fprintf(pFVar3,"%s\t%s\t%s\t%s\t%d\n",phVar5->basephone,phVar5->leftcontext,
              phVar5->rightcontext,phVar5->wordposition,phVar5->count);
      free_heapelement(phVar5);
    }
    fclose(pFVar3);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int32   print_counts(const char *countfn, phnhashelement_t  **CIhash,
		     hashelement_t **CDhash)
{
    heapelement_t **CDheap=NULL, **CIheap=NULL, *addphone, *addtriphone;
    hashelement_t *triphone_el; 
    phnhashelement_t *ciphone_el;
    int32 i, heapsize,cdheapsize,ciheapsize;
    FILE  *ofp;

    if ((ofp = fopen(countfn,"w")) == NULL){
	E_WARN("Unable to open %s for writing. Not writing counts!\n",countfn);
        return S3_ERROR;
    }
    fprintf(ofp,"base\tleft\tright\twdpos\tcount\n");

    ciheapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++){
	ciphone_el = CIhash[i];
	while (ciphone_el != NULL){
	    if (ciphone_el->count < 1) {
		ciphone_el = ciphone_el->next;
		continue;
	    }
	    addphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addphone->basephone = strdup(ciphone_el->phone);
	    addphone->count = ciphone_el->count;
	    ciheapsize = insert(&CIheap, ciheapsize, addphone);
	    ciphone_el = ciphone_el->next;
        }
    }
    heapsize = ciheapsize;
    for (i = 0; i < heapsize; i++) {
        addphone = yanktop(&CIheap,ciheapsize,&ciheapsize);
	fprintf(ofp,"%s\t-\t-\t-\t%d\n",addphone->basephone,addphone->count);
	free_heapelement(addphone);
    }

    cdheapsize = 0;
    for (i = 0; i < HASHSIZE; i++){
	triphone_el = CDhash[i];
	while (triphone_el != NULL){
	    if (triphone_el->count < 1) {
		triphone_el = triphone_el->next;
		continue;
	    }
	    addtriphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
	    addtriphone->basephone = strdup(triphone_el->basephone);
	    addtriphone->leftcontext = strdup(triphone_el->leftcontext);
	    addtriphone->rightcontext = strdup(triphone_el->rightcontext);
	    addtriphone->wordposition = strdup(triphone_el->wordposition);
	    addtriphone->count = triphone_el->count;
	    cdheapsize = insert(&CDheap, cdheapsize, addtriphone);
	    triphone_el = triphone_el->next;
        }
    }
    heapsize = cdheapsize;
    for (i = 0; i < heapsize; i++) {
        addtriphone = yanktop(&CDheap,cdheapsize,&cdheapsize);
	fprintf(ofp,"%s\t%s\t%s\t%s\t%d\n",addtriphone->basephone,
					   addtriphone->leftcontext,
					   addtriphone->rightcontext,
					   addtriphone->wordposition,
					   addtriphone->count);
	free_heapelement(addtriphone);
    }
    fclose(ofp);
    return S3_SUCCESS;
}